

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
::find_non_soo<std::__cxx11::string>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key,size_t hash)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  pointer __s2;
  size_t sVar6;
  size_t __n;
  uint uVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  ushort uVar24;
  int iVar25;
  ulong uVar26;
  anon_union_8_1_a8a14541_for_iterator_2 in_R8;
  ctrl_t *in_R9;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  bool bVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  iterator iVar35;
  __m128i match;
  ulong local_a8;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar3 = *(ulong *)(this + 0x10);
  uVar26 = (hash >> 7 ^ uVar3 >> 0xc) & uVar2;
  auVar32 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
  auVar32 = pshuflw(auVar32,auVar32,0);
  local_a8 = 0;
  do {
    pcVar1 = (char *)(uVar3 + uVar26);
    cVar8 = *pcVar1;
    cVar9 = pcVar1[1];
    cVar10 = pcVar1[2];
    cVar11 = pcVar1[3];
    cVar12 = pcVar1[4];
    cVar13 = pcVar1[5];
    cVar14 = pcVar1[6];
    cVar15 = pcVar1[7];
    cVar16 = pcVar1[8];
    cVar17 = pcVar1[9];
    cVar18 = pcVar1[10];
    cVar19 = pcVar1[0xb];
    cVar20 = pcVar1[0xc];
    cVar21 = pcVar1[0xd];
    cVar22 = pcVar1[0xe];
    cVar23 = pcVar1[0xf];
    local_58 = auVar32[0];
    cStack_57 = auVar32[1];
    cStack_56 = auVar32[2];
    cStack_55 = auVar32[3];
    auVar33[0] = -(local_58 == cVar8);
    auVar33[1] = -(cStack_57 == cVar9);
    auVar33[2] = -(cStack_56 == cVar10);
    auVar33[3] = -(cStack_55 == cVar11);
    auVar33[4] = -(local_58 == cVar12);
    auVar33[5] = -(cStack_57 == cVar13);
    auVar33[6] = -(cStack_56 == cVar14);
    auVar33[7] = -(cStack_55 == cVar15);
    auVar33[8] = -(local_58 == cVar16);
    auVar33[9] = -(cStack_57 == cVar17);
    auVar33[10] = -(cStack_56 == cVar18);
    auVar33[0xb] = -(cStack_55 == cVar19);
    auVar33[0xc] = -(local_58 == cVar20);
    auVar33[0xd] = -(cStack_57 == cVar21);
    auVar33[0xe] = -(cStack_56 == cVar22);
    auVar33[0xf] = -(cStack_55 == cVar23);
    uVar24 = (ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf;
    uVar28 = (uint)uVar24;
    bVar30 = uVar24 == 0;
    if (!bVar30) {
      lVar4 = *(long *)(this + 0x10);
      lVar5 = *(long *)(this + 0x18);
      __s2 = (key->_M_dataplus)._M_p;
      sVar6 = key->_M_string_length;
      do {
        uVar7 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        uVar27 = uVar7 + uVar26 & uVar2;
        lVar29 = uVar27 * 0x20;
        __n = *(size_t *)(lVar5 + 8 + lVar29);
        if (__n == sVar6) {
          if (__n == 0) {
            bVar31 = true;
          }
          else {
            iVar25 = bcmp(*(void **)(lVar5 + lVar29),__s2,__n);
            bVar31 = iVar25 == 0;
          }
        }
        else {
          bVar31 = false;
        }
        if (bVar31) {
          if (lVar4 == 0) {
            __assert_fail("ctrl != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x9ef,
                          "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string<char>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string<char>>]"
                         );
          }
          in_R8.slot_ = (slot_type *)(lVar29 + lVar5);
          in_R9 = (ctrl_t *)(uVar27 + lVar4);
        }
        if (bVar31) break;
        uVar24 = (ushort)(uVar28 - 1) & (ushort)uVar28;
        uVar28 = CONCAT22((short)(uVar28 - 1 >> 0x10),uVar24);
        bVar30 = uVar24 == 0;
      } while (!bVar30);
    }
    if (bVar30) {
      auVar34[0] = -(cVar8 == -0x80);
      auVar34[1] = -(cVar9 == -0x80);
      auVar34[2] = -(cVar10 == -0x80);
      auVar34[3] = -(cVar11 == -0x80);
      auVar34[4] = -(cVar12 == -0x80);
      auVar34[5] = -(cVar13 == -0x80);
      auVar34[6] = -(cVar14 == -0x80);
      auVar34[7] = -(cVar15 == -0x80);
      auVar34[8] = -(cVar16 == -0x80);
      auVar34[9] = -(cVar17 == -0x80);
      auVar34[10] = -(cVar18 == -0x80);
      auVar34[0xb] = -(cVar19 == -0x80);
      auVar34[0xc] = -(cVar20 == -0x80);
      auVar34[0xd] = -(cVar21 == -0x80);
      auVar34[0xe] = -(cVar22 == -0x80);
      auVar34[0xf] = -(cVar23 == -0x80);
      if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar34 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar34 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar34 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar34 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar34 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar34 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar34 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar34 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar34 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar34 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar34 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar34[0xf])
      {
        if (*(ulong *)this < local_a8 + 0x10) {
          __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xe37,
                        "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string<char>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string<char>>, K = std::basic_string<char>]"
                       );
        }
        uVar26 = uVar26 + local_a8 + 0x10 & uVar2;
        bVar30 = true;
        local_a8 = local_a8 + 0x10;
      }
      else {
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this);
        in_R9 = (ctrl_t *)0x0;
        bVar30 = false;
      }
    }
    else {
      bVar30 = false;
    }
    if (!bVar30) {
      iVar35.field_1.slot_ = in_R8.slot_;
      iVar35.ctrl_ = in_R9;
      return iVar35;
    }
  } while( true );
}

Assistant:

iterator find_non_soo(const key_arg<K>& key, size_t hash) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return iterator_at(seq.offset(i));
      }
      if (ABSL_PREDICT_TRUE(g.MaskEmpty())) return end();
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }